

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msgpuck.h
# Opt level: O1

char * mp_decode_str(char **data,uint32_t *len)

{
  byte bVar1;
  ushort uVar2;
  char *pcVar3;
  byte *pbVar4;
  uint uVar5;
  
  if (len == (uint32_t *)0x0) {
LAB_00107250:
    __assert_fail("len != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]tarantool-c/third_party/msgpuck/msgpuck.h"
                  ,0x821,"const char *mp_decode_str(const char **, uint32_t *)");
  }
  pbVar4 = (byte *)*data;
  bVar1 = *pbVar4;
  *data = (char *)(pbVar4 + 1);
  if (bVar1 == 0xdb) {
    uVar5 = *(uint *)(pbVar4 + 1);
    uVar5 = uVar5 >> 0x18 | (uVar5 & 0xff0000) >> 8 | (uVar5 & 0xff00) << 8 | uVar5 << 0x18;
    pbVar4 = pbVar4 + 5;
  }
  else {
    if (bVar1 == 0xda) {
      uVar2 = *(ushort *)(pbVar4 + 1);
      *data = (char *)(pbVar4 + 3);
      uVar5 = (uint)(ushort)(uVar2 << 8 | uVar2 >> 8);
      goto LAB_0010723c;
    }
    if (bVar1 != 0xd9) {
      if ((byte)(bVar1 + 0x40) < 0xe0) {
        mp_decode_str_cold_1();
        goto LAB_00107250;
      }
      uVar5 = bVar1 & 0x1f;
      goto LAB_0010723c;
    }
    uVar5 = (uint)pbVar4[1];
    pbVar4 = pbVar4 + 2;
  }
  *data = (char *)pbVar4;
LAB_0010723c:
  *len = uVar5;
  pcVar3 = *data;
  *data = pcVar3 + uVar5;
  return pcVar3;
}

Assistant:

MP_IMPL const char *
mp_decode_str(const char **data, uint32_t *len)
{
	assert(len != NULL);

	*len = mp_decode_strl(data);
	const char *str = *data;
	*data += *len;
	return str;
}